

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O2

void yy_4_lambda(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  G->val[-2] = (PVIPNode *)0x0;
  return;
}

Assistant:

YY_ACTION(void) yy_4_lambda(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define b G->val[-1]
#define p G->val[-2]
  yyprintf((stderr, "do yy_4_lambda"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {p=NULL; }\n"));
  p=NULL; ;
#undef b
#undef p
}